

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpl_model.c
# Opt level: O0

void av1_init_tpl_stats(TplParams *tpl_data)

{
  undefined4 *in_RDI;
  TplDepFrame *tpl_frame_1;
  int frame_idx_1;
  TplDepFrame *tpl_frame;
  int frame_idx;
  int local_1c;
  int local_c;
  
  *in_RDI = 0;
  set_tpl_stats_block_size((uint8_t *)(in_RDI + 1),(uint8_t *)((long)in_RDI + 5));
  for (local_c = 0; local_c < 0x69; local_c = local_c + 1) {
    *(undefined1 *)(in_RDI + (long)local_c * 0x18 + 2) = 0;
  }
  for (local_1c = 0; local_1c < 0x30; local_1c = local_1c + 1) {
    if (*(long *)(in_RDI + (long)local_1c * 2 + 0x9da) != 0) {
      memset(*(void **)(in_RDI + (long)local_1c * 2 + 0x9da),0,
             (long)(int)(in_RDI[(long)local_1c * 0x18 + 0x14] * in_RDI[(long)local_1c * 0x18 + 0x13]
                        ) * 200);
    }
  }
  return;
}

Assistant:

void av1_init_tpl_stats(TplParams *const tpl_data) {
  tpl_data->ready = 0;
  set_tpl_stats_block_size(&tpl_data->tpl_stats_block_mis_log2,
                           &tpl_data->tpl_bsize_1d);
  for (int frame_idx = 0; frame_idx < MAX_LENGTH_TPL_FRAME_STATS; ++frame_idx) {
    TplDepFrame *tpl_frame = &tpl_data->tpl_stats_buffer[frame_idx];
    tpl_frame->is_valid = 0;
  }
  for (int frame_idx = 0; frame_idx < MAX_LAG_BUFFERS; ++frame_idx) {
    TplDepFrame *tpl_frame = &tpl_data->tpl_stats_buffer[frame_idx];
    if (tpl_data->tpl_stats_pool[frame_idx] == NULL) continue;
    memset(tpl_data->tpl_stats_pool[frame_idx], 0,
           tpl_frame->height * tpl_frame->width *
               sizeof(*tpl_frame->tpl_stats_ptr));
  }
}